

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O2

void __thiscall Poll::compact(Poll *this)

{
  pointer ppVar1;
  int i;
  ulong uVar2;
  value_type fd;
  vector<pollfd,_std::allocator<pollfd>_> new_table;
  pollfd local_40;
  _Vector_base<pollfd,_std::allocator<pollfd>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar2 = 0;
      ppVar1 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppVar1 >> 3);
      uVar2 = uVar2 + 1) {
    local_40 = ppVar1[uVar2];
    std::vector<pollfd,_std::allocator<pollfd>_>::push_back
              ((vector<pollfd,_std::allocator<pollfd>_> *)&local_38,&local_40);
  }
  std::vector<pollfd,_std::allocator<pollfd>_>::operator=
            (&this->fds,(vector<pollfd,_std::allocator<pollfd>_> *)&local_38);
  std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void Poll::compact() {
  std::vector<pollfd> new_table;
  for (int i = 0; i < fds.size(); ++i) {
    auto fd = fds[i];
    if (fd.fd != DELETED) {
      new_table.push_back(fd);
    }
  }
  this->fds = new_table;
}